

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O3

int uv_queue_work(uv_loop_t *loop,uv_work_t *req,uv_work_cb work_cb,uv_after_work_cb after_work_cb)

{
  uv_after_work_cb after_work_cb_local;
  uv_work_cb work_cb_local;
  uv_work_t *req_local;
  uv_loop_t *loop_local;
  
  if (work_cb == (uv_work_cb)0x0) {
    loop_local._4_4_ = -0x16;
  }
  else {
    req->type = UV_WORK;
    (loop->active_reqs).count = (loop->active_reqs).count + 1;
    req->loop = loop;
    req->work_cb = work_cb;
    req->after_work_cb = after_work_cb;
    uv__work_submit(loop,&req->work_req,UV__WORK_CPU,uv__queue_work,uv__queue_done);
    loop_local._4_4_ = 0;
  }
  return loop_local._4_4_;
}

Assistant:

int uv_queue_work(uv_loop_t* loop,
                  uv_work_t* req,
                  uv_work_cb work_cb,
                  uv_after_work_cb after_work_cb) {
  if (work_cb == NULL)
    return UV_EINVAL;

  uv__req_init(loop, req, UV_WORK);
  req->loop = loop;
  req->work_cb = work_cb;
  req->after_work_cb = after_work_cb;
  uv__work_submit(loop,
                  &req->work_req,
                  UV__WORK_CPU,
                  uv__queue_work,
                  uv__queue_done);
  return 0;
}